

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_interpreter_validateThenAnalyzeAndEvaluateASTWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode,sysbvm_tuple_t environment)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t *local_60;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t sStack_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  sysbvm_tuple_t *local_28;
  sysbvm_tuple_t local_20;
  
  puStack_30 = (undefined1 *)&local_68;
  local_58 = 0;
  sStack_50 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 4;
  local_68 = environment;
  local_60 = (sysbvm_tuple_t *)astNode;
  sysbvm_stackFrame_pushRecord(&local_48);
  uVar1 = (ulong)local_60 & 0xf;
  if (uVar1 == 0 && local_60 != (sysbvm_tuple_t *)0x0) {
    sVar2 = *local_60;
  }
  else if ((int)uVar1 == 0xf) {
    sVar2 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_60 >> 4);
  }
  else {
    sVar2 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar1);
  }
  local_58 = sysbvm_type_getAstNodeValidationWithAnalysisAndEvaluationFunction(context,sVar2);
  if (local_58 == 0) {
    uVar1 = (ulong)local_60 & 0xf;
    if (uVar1 == 0 && local_60 != (sysbvm_tuple_t *)0x0) {
      sVar2 = *local_60;
    }
    else if ((int)uVar1 == 0xf) {
      sVar2 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_60 >> 4);
    }
    else {
      sVar2 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar1);
    }
    local_58 = sysbvm_type_getAstNodeAnalysisAndEvaluationFunction(context,sVar2);
    if (local_58 == 0) {
      sysbvm_error("Cannot validate, analyze and evaluate non AST node tuple.");
    }
  }
  local_28 = local_60;
  local_20 = local_68;
  sStack_50 = sysbvm_function_apply(context,local_58,2,(sysbvm_tuple_t *)&local_28,1);
  sysbvm_stackFrame_popRecord(&local_48);
  return sStack_50;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_validateThenAnalyzeAndEvaluateASTWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode, sysbvm_tuple_t environment)
{
    struct {
        sysbvm_tuple_t environment;
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t function;
        sysbvm_tuple_t result;
    } gcFrame = {
        .environment = environment,
        .astNode = astNode,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.function = sysbvm_type_getAstNodeValidationWithAnalysisAndEvaluationFunction(context, sysbvm_tuple_getType(context, gcFrame.astNode));
    if(!gcFrame.function)
    {
        gcFrame.function = sysbvm_type_getAstNodeAnalysisAndEvaluationFunction(context, sysbvm_tuple_getType(context, gcFrame.astNode));
        if(!gcFrame.function)
            sysbvm_error("Cannot validate, analyze and evaluate non AST node tuple.");
    }

    gcFrame.result = sysbvm_function_applyNoCheck2(context, gcFrame.function, gcFrame.astNode, gcFrame.environment);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}